

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void slang::ast::SFormat::formatStrength(string *result,SVInt *value)

{
  logic_t lVar1;
  bitwidth_t bVar2;
  char *__s;
  
  for (bVar2 = (value->super_SVIntStorage).bitWidth; bVar2 != 0; bVar2 = bVar2 - 1) {
    lVar1 = SVInt::operator[](value,bVar2 - 1);
    __s = "St0";
    if (lVar1.value != '\0') {
      if (lVar1.value == 0x80) {
        __s = "StX";
      }
      else if (lVar1.value == '@') {
        __s = "HiZ";
      }
      else {
        __s = "St1";
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (result,__s);
    if (bVar2 != 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (result," ");
    }
  }
  return;
}

Assistant:

void formatStrength(std::string& result, const SVInt& value) {
    for (bitwidth_t i = value.getBitWidth(); i > 0; i--) {
        // At compile time it's impossible to know strength values so
        // we will always put "Strong" here, or "Hi" if it's high impedance.
        logic_t l = value[int32_t(i) - 1];
        switch (l.value) {
            case 0:
                result += "St0";
                break;
            case 1:
                result += "St1";
                break;
            case logic_t::X_VALUE:
                result += "StX";
                break;
            case logic_t::Z_VALUE:
                result += "HiZ";
                break;
            default:
                SLANG_UNREACHABLE;
        }

        if (i != 1)
            result += " ";
    }
}